

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int add_pending_write_callback(CMConnection conn,CMWriteCallbackFunc handler,void *client_data)

{
  CMConnHandlerList p_Var1;
  CMConnHandlerList p_Var2;
  size_t sVar3;
  size_t sVar4;
  
  p_Var1 = conn->write_callbacks;
  if (p_Var1 == (CMConnHandlerList)0x0) {
    sVar4 = 0;
  }
  else {
    sVar3 = 0;
    p_Var2 = p_Var1;
    do {
      sVar4 = conn->write_callback_len;
      if ((conn->write_callback_len == sVar3) ||
         (sVar4 = sVar3, p_Var2->func == (CMCloseHandlerFunc)0x0)) break;
      sVar3 = sVar3 + 1;
      p_Var2 = p_Var2 + 1;
      sVar4 = sVar3;
    } while (p_Var1 != (CMConnHandlerList)0x0);
  }
  sVar3 = (size_t)((int)sVar4 + 1);
  if (conn->write_callback_len < sVar3) {
    if (p_Var1 == (CMConnHandlerList)0x0) {
      p_Var1 = (CMConnHandlerList)INT_CMmalloc(0x10);
      sVar3 = 1;
    }
    else {
      p_Var1 = (CMConnHandlerList)INT_CMrealloc(p_Var1,sVar3 << 4);
    }
    conn->write_callbacks = p_Var1;
    conn->write_callback_len = sVar3;
  }
  p_Var1 = conn->write_callbacks;
  p_Var1[sVar4 & 0xffffffff].func = handler;
  p_Var1[sVar4 & 0xffffffff].client_data = client_data;
  return (int)sVar4;
}

Assistant:

static int
 add_pending_write_callback(CMConnection conn, CMWriteCallbackFunc handler, 
			    void* client_data)
 {
     int count = 0;
     while (conn->write_callbacks && count < conn->write_callback_len &&
	    (conn->write_callbacks[count].func != NULL)) count++;
     if (count + 1 > conn->write_callback_len) {
	 if (conn->write_callbacks == NULL) {
	     conn->write_callbacks = malloc(sizeof(conn->write_callbacks[0]));
	     conn->write_callback_len = 1;
	 } else {
	     conn->write_callbacks = 
		 realloc(conn->write_callbacks,
			 sizeof(conn->write_callbacks[0])*(count+1));
	     conn->write_callback_len = count+1;
	 }
     }
     conn->write_callbacks[count].func = handler;
     conn->write_callbacks[count].client_data = client_data;
     return count;
 }